

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgExpression.cpp
# Opt level: O1

float rsg::VariableRead::getWeight(GeneratorState *state,ConstValueRangeAccess valueRange)

{
  Storage SVar1;
  VariableManager *pVVar2;
  pointer ppVVar3;
  bool bVar4;
  bool bVar5;
  uint uVar6;
  pointer ppVVar7;
  float fVar8;
  IsReadableIntersectingEntry local_60;
  undefined4 uStack_3c;
  undefined4 local_38;
  undefined4 uStack_34;
  undefined4 uStack_30;
  undefined4 uStack_2c;
  Scalar *local_28;
  
  if ((valueRange.m_type)->m_baseType == TYPE_VOID) {
    pVVar2 = state->m_varManager;
    ppVVar7 = (pVVar2->m_entryCache).
              super__Vector_base<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    ppVVar3 = (pVVar2->m_entryCache).
              super__Vector_base<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    bVar4 = ppVVar7 != ppVVar3;
    if ((bVar4) &&
       (uVar6 = (state->m_exprFlagStack).
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_finish[-1] & 1, uVar6 != 0)) {
      SVar1 = (*ppVVar7)->m_variable->m_storage;
      while (SVar1 != STORAGE_CONST) {
        ppVVar7 = ppVVar7 + 1;
        bVar4 = ppVVar7 != ppVVar3;
        if ((ppVVar7 == ppVVar3) || (uVar6 == 0)) break;
        SVar1 = (*ppVVar7)->m_variable->m_storage;
      }
    }
    fVar8 = 0.05;
    if ((!bVar4) &&
       (state->m_shaderParams->maxCombinedVariableScalars <= pVVar2->m_numAllocatedScalars)) {
      fVar8 = 0.0;
    }
  }
  else {
    bVar4 = anon_unknown_0::canAllocateVariable(state,valueRange.m_type);
    if (!bVar4) {
      pVVar2 = state->m_varManager;
      local_60.super_IsReadableEntry.m_exprFlags =
           (state->m_exprFlagStack).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_finish[-1];
      local_28 = valueRange.m_max;
      local_38 = valueRange.m_type._0_4_;
      uStack_34 = valueRange.m_type._4_4_;
      uStack_30 = valueRange.m_min._0_4_;
      uStack_2c = valueRange.m_min._4_4_;
      local_60.m_valueRange.m_max = valueRange.m_max;
      local_60.m_valueRange.m_type._0_4_ = local_38;
      local_60._4_4_ = uStack_3c;
      local_60.m_valueRange.m_type._4_4_ = uStack_34;
      local_60.m_valueRange.m_min._0_4_ = uStack_30;
      ppVVar7 = (pVVar2->m_entryCache).
                super__Vector_base<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      bVar4 = ppVVar7 !=
              (pVVar2->m_entryCache).
              super__Vector_base<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
      if ((bVar4) &&
         (local_60.m_valueRange.m_min._4_4_ = uStack_2c,
         bVar5 = anon_unknown_0::IsReadableIntersectingEntry::operator()(&local_60,*ppVVar7), !bVar5
         )) {
        do {
          ppVVar7 = ppVVar7 + 1;
          bVar5 = ppVVar7 ==
                  (pVVar2->m_entryCache).
                  super__Vector_base<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
          bVar4 = !bVar5;
          if (bVar5) break;
          bVar5 = anon_unknown_0::IsReadableIntersectingEntry::operator()(&local_60,*ppVVar7);
        } while (!bVar5);
      }
      if (!bVar4) {
        return 0.0;
      }
    }
    fVar8 = 1.0;
  }
  return fVar8;
}

Assistant:

float VariableRead::getWeight (const GeneratorState& state, ConstValueRangeAccess valueRange)
{
	if (valueRange.getType().isVoid())
	{
		if (state.getVariableManager().hasEntry(IsReadableEntry(state.getExpressionFlags())) ||
			state.getVariableManager().getNumAllocatedScalars() < state.getShaderParameters().maxCombinedVariableScalars)
			return unusedValueWeight;
		else
			return 0.0f;
	}

	if (!canAllocateVariable(state, valueRange.getType()) &&
		!state.getVariableManager().hasEntry(IsReadableIntersectingEntry(valueRange, state.getExpressionFlags())))
		return 0.0f;
	else
		return 1.0f;
}